

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void qcc_stream_end(qcc_stream *self)

{
  qcc_stream_interval *node;
  qcc_stream_node *pqVar1;
  
  node = (self->interval_stack).first;
  qcc_list_pop_front((qcc_list *)&self->interval_stack);
  pqVar1 = self->node;
  node->end = pqVar1;
  if (node->begin != pqVar1) {
    qcc_list_push_back((qcc_list *)&self->interval_data,(qcc_list_node *)node);
    return;
  }
  return;
}

Assistant:

void qcc_stream_end(struct qcc_stream *self)
{
    struct qcc_stream_interval *interval = self->interval_stack.first;
    qcc_interval_data_pop_front(&self->interval_stack);
    interval->end = self->node;
    if (interval->begin != interval->end)
        qcc_interval_data_push_back(&self->interval_data, interval);
}